

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSGetNumMassSetups(void *arkode_mem,long *nmsetups)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassSetups",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmsetups = local_18->nmsetups;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassSetups(void *arkode_mem, long int *nmsetups)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassSetups",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmsetups = arkls_mem->nmsetups;
  return(ARKLS_SUCCESS);
}